

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O3

int sprkStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar3 = -0x15;
    error_code = -0x15;
    iVar2 = 0x32b;
  }
  else {
    if ((uint)mode < 3) {
      iVar2 = (**(code **)((long)pvVar1 + 0x20))(y,f,ark_mem->user_data);
      *(long *)((long)pvVar1 + 0x30) = *(long *)((long)pvVar1 + 0x30) + 1;
      if (iVar2 == 0) {
        iVar2 = (**(code **)((long)pvVar1 + 0x28))(t,y,f,ark_mem->user_data);
        *(long *)((long)pvVar1 + 0x38) = *(long *)((long)pvVar1 + 0x38) + 1;
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = 0x1f8;
      }
      else {
        iVar2 = 0x1f0;
      }
      arkProcessError(ark_mem,-8,iVar2,"sprkStep_FullRHS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                      ,
                      "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                      ,t);
      return -8;
    }
    msgfmt = "Unknown full RHS mode";
    iVar3 = -8;
    error_code = -8;
    iVar2 = 0x201;
  }
  arkProcessError(ark_mem,error_code,iVar2,"sprkStep_FullRHS",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int sprkStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y, N_Vector f,
                     int mode)
{
  int retval                 = 0;
  ARKodeSPRKStepMem step_mem = NULL;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:
  case ARK_FULLRHS_END:
  case ARK_FULLRHS_OTHER:

    /* Since f1 and f2 do not have overlapping outputs and so the f vector is
       passed to both RHS functions. */

    retval = sprkStep_f1(step_mem, t, y, f, ark_mem->user_data);
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return (ARK_RHSFUNC_FAIL);
    }

    retval = sprkStep_f2(step_mem, t, y, f, ark_mem->user_data);
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return (ARK_RHSFUNC_FAIL);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return (ARK_RHSFUNC_FAIL);
  }

  return (ARK_SUCCESS);
}